

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O1

_Bool textui_get_item(object **choice,char *pmt,char *str,cmd_code cmd,item_tester tester,
                     wchar_t mode)

{
  uint32_t *puVar1;
  ushort uVar2;
  player_upkeep *ppVar3;
  bool bVar4;
  player *ppVar5;
  cmd_code lookup_cmd;
  size_t sVar6;
  _Bool _Var7;
  byte bVar8;
  wchar_t wVar9;
  int iVar10;
  object *poVar11;
  size_t sVar12;
  menu *menu;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  olist_detail_t oVar16;
  int iVar17;
  wchar_t wVar18;
  long lVar19;
  object **ppoVar20;
  byte bVar21;
  object *poVar22;
  byte bVar23;
  char *pcVar24;
  uint uVar25;
  byte bVar26;
  ulong uVar27;
  byte bVar28;
  bool bVar29;
  ui_event uVar30;
  char out_val [75];
  char tmp_val [75];
  char local_d8 [80];
  menu_iter local_88 [2];
  
  uVar2 = z_info->floor_size;
  uVar25 = (uint)z_info->pack_size + (uint)uVar2 + (uint)z_info->quiver_size;
  floor_list = (object **)mem_zalloc((ulong)((uint)uVar2 * 8));
  throwing_list = (object **)mem_zalloc((ulong)(uVar25 * 8));
  allow_all = str == (char *)0x0;
  bVar23 = (byte)mode;
  oVar16 = OLIST_FAIL;
  if ((mode & 0x40U) == 0) {
    oVar16 = OLIST_WEIGHT;
  }
  olist_mode = (uint)mode >> 1 & OLIST_PRICE | oVar16;
  if (((uint)mode >> 8 & 1) != 0) {
    olist_mode = olist_mode | OLIST_SEMPTY;
  }
  if ((char)bVar23 < '\0') {
    olist_mode = olist_mode | OLIST_QUIVER;
  }
  if (((uint)mode >> 10 & 1) != 0) {
    olist_mode = (olist_detail_t)CONCAT11(1,(undefined1)olist_mode);
  }
  item_mode = mode;
  item_cmd = cmd;
  tester_m = tester;
  prompt = pmt;
  event_signal(EVENT_MESSAGE_FLUSH);
  i1 = L'\0';
  i2 = L'\xffffffff';
  if ((mode & 2U) != 0) {
    i2 = (uint)z_info->pack_size + L'\xffffffff';
  }
  if (L'\xffffffff' < i2) {
    do {
      _Var7 = object_test(tester,player->upkeep->inven[i1]);
      if (_Var7) break;
      wVar9 = i1 + L'\x01';
      bVar4 = i1 < i2;
      i1 = wVar9;
    } while (bVar4);
  }
  if (i1 <= i2) {
    do {
      _Var7 = object_test(tester,player->upkeep->inven[i2]);
      if (_Var7) break;
      wVar9 = i2 + L'\xffffffff';
      bVar4 = i1 < i2;
      i2 = wVar9;
    } while (bVar4);
  }
  bVar8 = 1;
  if ((i2 < i1) && (allow_all == false)) {
    if ((item_mode & 2U) != 0) {
      item_mode = item_mode + L'\xfffffffe';
    }
    bVar8 = 0;
  }
  e1 = L'\0';
  e2 = L'\xffffffff';
  if ((mode & 1U) != 0) {
    e2 = (uint)(player->body).count + L'\xffffffff';
  }
  if (cmd != CMD_NULL || tester != (item_tester)0x0) {
    if (L'\xffffffff' < e2) {
      do {
        poVar11 = slot_object(player,e1);
        _Var7 = object_test(tester,poVar11);
        if (_Var7) break;
        wVar9 = e1 + L'\x01';
        bVar4 = e1 < e2;
        e1 = wVar9;
      } while (bVar4);
    }
    if (e1 <= e2) {
      do {
        poVar11 = slot_object(player,e2);
        _Var7 = object_test(tester,poVar11);
        if (_Var7) break;
        wVar9 = e2 + L'\xffffffff';
        bVar4 = e1 < e2;
        e2 = wVar9;
      } while (bVar4);
    }
  }
  bVar28 = 1;
  if ((e2 < e1) && (allow_all == false)) {
    if ((item_mode & 1U) != 0) {
      item_mode = item_mode + L'\xffffffff';
    }
    bVar28 = 0;
  }
  q1 = L'\0';
  q2 = L'\xffffffff';
  if ((mode & 8U) != 0) {
    q2 = (uint)z_info->quiver_size + L'\xffffffff';
  }
  if (L'\xffffffff' < q2) {
    do {
      _Var7 = object_test(tester,player->upkeep->quiver[q1]);
      if (_Var7) break;
      wVar9 = q1 + L'\x01';
      bVar4 = q1 < q2;
      q1 = wVar9;
    } while (bVar4);
  }
  if (q1 <= q2) {
    do {
      _Var7 = object_test(tester,player->upkeep->quiver[q2]);
      if (_Var7) break;
      wVar9 = q2 + L'\xffffffff';
      bVar4 = q1 < q2;
      q2 = wVar9;
    } while (bVar4);
  }
  bVar21 = 1;
  if ((q2 < q1) && (allow_all == false)) {
    if ((item_mode & 8U) != 0) {
      item_mode = item_mode + L'\xfffffff8';
    }
    bVar21 = 0;
  }
  wVar9 = scan_floor(floor_list,(uint)uVar2,player,OFLOOR_VISIBLE|OFLOOR_SENSE|OFLOOR_TEST,tester);
  f1 = L'\0';
  f2 = L'\xffffffff';
  if ((mode & 4U) != 0) {
    f2 = wVar9 + L'\xffffffff';
  }
  if (L'\xffffffff' < f2) {
    do {
      _Var7 = object_test(tester,floor_list[f1]);
      if (_Var7) break;
      wVar9 = f1 + L'\x01';
      bVar4 = f1 < f2;
      f1 = wVar9;
    } while (bVar4);
  }
  if (f1 <= f2) {
    do {
      _Var7 = object_test(tester,floor_list[f2]);
      if (_Var7) break;
      wVar9 = f2 + L'\xffffffff';
      bVar4 = f1 < f2;
      f2 = wVar9;
    } while (bVar4);
  }
  bVar26 = 1;
  if ((f2 < f1) && (allow_all == false)) {
    if ((item_mode & 4U) != 0) {
      item_mode = item_mode + L'\xfffffffc';
    }
    bVar26 = 0;
  }
  throwing_num = scan_items(throwing_list,(ulong)uVar25,player,L'\x0e',obj_is_throwing);
  if ((byte)(bVar8 | bVar28 | bVar21 | bVar26) != 1) {
    if (str != (char *)0x0) {
      msg("%s");
    }
    *choice = (object *)0x0;
    goto LAB_001dfddb;
  }
  if ((((uint)mode >> 0xb & 1) == 0) || (wVar9 = L'ࠀ', throwing_num == L'\0')) {
    wVar18 = player->upkeep->command_wrk;
    wVar9 = L'\x01';
    if (((bVar28 & wVar18 == L'\x01') == 0) && (wVar9 = L'\x02', (bVar8 & wVar18 == L'\x02') == 0))
    {
      if ((bVar21 & wVar18 == L'\b') == 0) {
        wVar9 = L'\x04';
        if ((bVar26 & wVar18 == L'\x04') == 0) {
          if ((cmd != CMD_USE & (byte)((uint)mode >> 9) & bVar21) != 0) goto LAB_001df14a;
          wVar9 = L'\x02';
          if ((((bVar23 >> 1 & bVar8) == 0) && (wVar9 = L'\x01', (bVar23 & bVar28) == 0)) &&
             (wVar9 = L'\b', (bVar23 >> 3 & bVar21) == 0)) {
            wVar9 = L'\x02';
            if ((mode & 4U) != 0) {
              wVar9 = (uint)bVar26 * 2 + L'\x02';
            }
          }
        }
      }
      else {
LAB_001df14a:
        wVar9 = L'\b';
      }
    }
  }
  player->upkeep->command_wrk = wVar9;
  bVar4 = false;
  do {
    lVar19 = 0;
    iVar10 = 0;
    iVar17 = 0;
    do {
      if (angband_term[lVar19] != (term *)0x0) {
        iVar17 = iVar17 + (window_flag[lVar19] & 1);
        iVar10 = iVar10 + (uint)((window_flag[lVar19] >> 1 & 1) != 0);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != 8);
    if ((iVar17 != 0) != (iVar10 != 0)) {
      wVar9 = player->upkeep->command_wrk;
      if (wVar9 == L'\x02') {
        bVar29 = iVar17 == 0;
        iVar17 = iVar10;
        if (bVar29) {
joined_r0x001df222:
          if ((iVar17 == 0) || (!bVar4)) goto LAB_001df250;
        }
        else {
joined_r0x001df21e:
          if (bVar4) goto joined_r0x001df222;
        }
        toggle_inven_equip();
        bVar4 = (bool)(bVar4 ^ 1);
      }
      else {
        if (wVar9 == L'\x01') {
          if (iVar10 != 0) goto joined_r0x001df21e;
          goto joined_r0x001df222;
        }
        if (bVar4) {
          toggle_inven_equip();
          bVar4 = false;
        }
      }
    }
LAB_001df250:
    ppVar5 = player;
    puVar1 = &player->upkeep->redraw;
    *puVar1 = *puVar1 | 0x60000;
    redraw_stuff(ppVar5);
    screen_save();
    wipe_obj_list();
    ppVar3 = player->upkeep;
    switch(ppVar3->command_wrk) {
    case L'\x01':
      ppoVar20 = (object **)0x0;
      wVar9 = e2;
      break;
    case L'\x02':
      ppoVar20 = ppVar3->inven;
      wVar9 = i2;
      break;
    case L'\x03':
    case L'\x05':
    case L'\x06':
    case L'\a':
      goto switchD_001df293_caseD_3;
    case L'\x04':
      ppoVar20 = floor_list;
      wVar9 = f2;
      break;
    case L'\b':
      ppoVar20 = ppVar3->quiver;
      wVar9 = q2;
      break;
    default:
      ppoVar20 = throwing_list;
      wVar9 = throwing_num;
      if (ppVar3->command_wrk == L'ࠀ') break;
      goto switchD_001df293_caseD_3;
    }
    build_obj_list(wVar9,ppoVar20,tester_m,olist_mode);
switchD_001df293_caseD_3:
    _Var7 = allow_all;
    wVar18 = item_mode;
    bVar29 = f1 <= f2;
    wVar9 = player->upkeep->command_wrk;
    if (wVar9 < L'\b') {
      if (wVar9 == L'\x01') {
        strnfmt(local_d8,0x4b,"Equip:");
        if (e1 <= e2) {
          strnfmt((char *)local_88,0x4b," %c-%c,",
                  (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[e1],
                  (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[e2]);
LAB_001df54c:
          my_strcat(local_d8,(char *)local_88,0x4b);
        }
LAB_001df551:
        if ((wVar18 & 2U) != 0) {
          pcVar24 = " / for Inven,";
LAB_001df567:
          my_strcat(local_d8,pcVar24,0x4b);
        }
LAB_001df56c:
        if ((wVar18 & 8U) != 0) {
          pcVar24 = " | for Quiver,";
LAB_001df601:
          my_strcat(local_d8,pcVar24,0x4b);
        }
        goto LAB_001df606;
      }
      if (wVar9 == L'\x02') {
        strnfmt(local_d8,0x4b,"Inven:");
        if (i1 <= i2) {
          strnfmt((char *)local_88,0x4b," %c-%c,",
                  (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i1],
                  (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i2]);
          my_strcat(local_d8,(char *)local_88,0x4b);
        }
        if ((wVar18 & 1U) != 0) {
          pcVar24 = " / for Equip,";
          goto LAB_001df567;
        }
        goto LAB_001df56c;
      }
LAB_001df43d:
      strnfmt(local_d8,0x4b,"Floor:");
      if (f1 <= f2) {
        strnfmt((char *)local_88,0x4b," %c-%c,",
                (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[f1],
                (ulong)(uint)(int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[f2]);
        my_strcat(local_d8,(char *)local_88,0x4b);
      }
      if ((wVar18 & 3U) != 0) {
        pcVar24 = " / for Inven,";
        if ((wVar18 & 2U) == 0) {
          pcVar24 = " / for Equip,";
        }
        my_strcat(local_d8,pcVar24,0x4b);
      }
      pcVar24 = " | for Quiver,";
      if ((wVar18 & 8U) != 0) goto LAB_001df61f;
    }
    else {
      if (wVar9 != L'\b') {
        if (wVar9 != L'ࠀ') goto LAB_001df43d;
        strnfmt(local_d8,0x4b,"Throwing items:");
        if ((long)throwing_num != 0) {
          strnfmt((char *)local_88,0x4b," a-%c,",
                  (ulong)(uint)(int)(char)(&DAT_0027e39f)[throwing_num]);
          goto LAB_001df54c;
        }
        goto LAB_001df551;
      }
      strnfmt(local_d8,0x4b,"Quiver:");
      if (q1 <= q2) {
        strnfmt((char *)local_88,0x4b," %d-%d,");
        my_strcat(local_d8,(char *)local_88,0x4b);
      }
      if ((wVar18 & 3U) != 0) {
        pcVar24 = " / for Inven,";
        if ((wVar18 & 2U) == 0) {
          pcVar24 = " / for Equip,";
        }
        goto LAB_001df601;
      }
LAB_001df606:
      pcVar24 = " - for floor,";
      if (bVar29 || (_Var7 & 1U) != 0) {
LAB_001df61f:
        my_strcat(local_d8,pcVar24,0x4b);
      }
    }
    my_strcat(local_d8," ESC",0x4b);
    strnfmt(header,0x50,"(%s)",local_d8);
    if (pmt == (char *)0x0) {
      newmenu = '\0';
      wVar9 = L'\r';
    }
    else {
      prt(pmt,L'\0',L'\0');
      sVar12 = strlen(pmt);
      prt(header,L'\0',(int)sVar12 + L'\x01');
      newmenu = '\0';
      sVar12 = strlen(pmt);
      iVar17 = (int)sVar12;
      if (sVar12 < 0x10) {
        iVar17 = 0xf;
      }
      wVar9 = iVar17 + L'\xfffffffe';
    }
    local_88[0].resize = (_func_void_menu_ptr *)0x0;
    local_88[0].display_row = get_item_display;
    local_88[0].row_handler = get_item_action;
    local_88[0].get_tag = get_item_tag;
    local_88[0].valid_row = get_item_validity;
    menu = menu_new(MN_SKIN_OBJECT,local_88);
    menu_setpriv(menu,num_obj,items);
    pcVar24 = "0123456789";
    if (player->upkeep->command_wrk != L'\b') {
      pcVar24 = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
    }
    menu->selections = pcVar24;
    menu->switch_keys = "/|-";
    menu->context_hook = use_context_menu_list_switcher;
    menu->flags = 0x44;
    menu->browse_hook = item_menu_browser;
    pcVar24 = (char *)mem_zalloc(10);
    menu->inscriptions = pcVar24;
    uVar15 = 0;
    poVar11 = (object *)0x0;
    do {
      lookup_cmd = item_cmd;
      bVar23 = (byte)uVar15 | 0x30;
      _Var7 = (player->opts).opt[1];
      if ((item_mode & 0x200U) == 0) {
LAB_001df7d6:
        poVar22 = poVar11;
        if (L'\0' < num_obj) {
          lVar19 = 0;
          do {
            poVar11 = items[lVar19].object;
            bVar29 = false;
            if ((poVar11 != (object *)0x0) && (poVar11->note != 0)) {
              pcVar24 = quark_str(poVar11->note);
              pcVar24 = strchr(pcVar24,0x40);
              do {
                if (pcVar24 == (char *)0x0) {
                  bVar29 = false;
                  goto LAB_001df87d;
                }
                if (pcVar24[1] == bVar23) {
LAB_001df82b:
                  bVar29 = false;
                  poVar22 = poVar11;
                }
                else {
                  bVar8 = cmd_lookup_key_unktrl(lookup_cmd,(uint)_Var7);
                  if (((int)pcVar24[1] == (uint)bVar8) && (pcVar24[2] == bVar23)) goto LAB_001df82b;
                  pcVar24 = strchr(pcVar24 + 1,0x40);
                  bVar29 = true;
                }
              } while (bVar29);
              bVar29 = true;
            }
LAB_001df87d:
            if (bVar29) {
              bVar29 = true;
              goto LAB_001df89d;
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < num_obj);
        }
        bVar29 = false;
      }
      else {
        poVar22 = player->upkeep->quiver[(uVar15 & 0xff | 0x30) - 0x30];
        bVar29 = true;
        if (poVar22 == (object *)0x0) goto LAB_001df7d6;
      }
LAB_001df89d:
      if ((bVar29) && (uVar13 = (ulong)num_obj, 0 < (long)uVar13)) {
        if (items[0].object == poVar22) {
          bVar29 = true;
          uVar27 = 0;
        }
        else {
          uVar27 = 0;
          ppoVar20 = &items[1].object;
          do {
            if (uVar13 - 1 == uVar27) goto LAB_001df918;
            uVar27 = uVar27 + 1;
            poVar11 = *ppoVar20;
            ppoVar20 = ppoVar20 + 0x20;
          } while (poVar11 != poVar22);
          bVar29 = uVar27 < uVar13;
        }
        if (bVar29) {
          pvVar14 = menu_priv(menu);
          menu->inscriptions[uVar15] = *(char *)((long)pvVar14 + uVar27 * 0x100 + 0xf8);
        }
      }
LAB_001df918:
      uVar15 = uVar15 + 1;
      poVar11 = poVar22;
    } while (uVar15 != 10);
    selection = (object *)0x0;
    set_obj_names(false,player);
    if ((((mode & 2U) != 0) && (*player->upkeep->quiver != (object *)0x0)) && (max_len < 0x19)) {
      max_len = 0x18;
    }
    uVar25 = 0;
    if ((olist_mode & OLIST_WEIGHT) != OLIST_NONE) {
      ex_width = ex_width + L'\t';
      uVar25 = 9;
    }
    if ((olist_mode & OLIST_PRICE) != OLIST_NONE) {
      ex_width = ex_width + L'\t';
      uVar25 = uVar25 + 9;
    }
    if ((olist_mode & OLIST_FAIL) != OLIST_NONE) {
      ex_width = ex_width + L'\n';
      uVar25 = uVar25 + 10;
    }
    area.page_rows = menu->count;
    area.row = L'\x01';
    area.col = (~(wchar_t)max_len + Term->wid) - ex_width;
    if (wVar9 <= area.col) {
      area.col = wVar9;
    }
    if (area.col < L'\x04') {
      area.col = L'\0';
    }
    ex_offset = (~ex_width + Term->wid) - area.col;
    if (max_len <= (ulong)(long)ex_offset) {
      ex_offset = (wchar_t)max_len;
    }
    do {
      sVar12 = strlen(header);
      if (max_len + uVar25 + (long)ex_width <= sVar12) break;
      my_strcat(header," ",0x50);
      sVar12 = strlen(header);
    } while (sVar12 < 0x4f);
    sVar6 = max_len;
    sVar12 = strlen(header);
    if (sVar12 < sVar6) {
      sVar12 = sVar6;
    }
    area.width = (wchar_t)sVar12;
    wVar9 = area.row;
    if (L'\0' < area.page_rows) {
      do {
        wVar18 = area.col;
        if (area.col < L'\x02') {
          wVar18 = L'\x01';
        }
        prt("",wVar9,wVar18 + L'\xffffffff');
        wVar9 = wVar9 + L'\x01';
      } while (wVar9 < area.page_rows + area.row);
    }
    menu_layout(menu,(region *)&area);
    uVar30 = menu_select(menu,0,true);
    mem_free(menu->inscriptions);
    mem_free(menu);
    if ((uVar30.type != EVT_SWITCH) || (newmenu != '\0')) goto LAB_001dfd78;
    uVar15 = (ulong)uVar30.mouse & 0xffffffff00000000;
    wVar9 = player->upkeep->command_wrk;
    switch(wVar9) {
    case L'\x01':
      if (uVar15 == 0x8100000000) {
        wVar9 = L'\x04';
        if ((f2 < f1) && (wVar9 = L'\b', q2 < q1)) {
LAB_001dfd20:
          wVar9 = L'\x02';
          if (i2 < i1) break;
        }
      }
      else {
        wVar9 = L'\x02';
        if ((i2 < i1) && (wVar9 = L'\b', q2 < q1)) {
LAB_001dfd5b:
          wVar9 = L'\x04';
          if (f2 < f1) break;
        }
      }
      goto LAB_001dfd6e;
    case L'\x02':
      if (uVar15 == 0x8100000000) {
        wVar9 = L'\x01';
        if ((e1 <= e2) || (wVar9 = L'\x04', f1 <= f2)) goto LAB_001dfd6e;
LAB_001dfc9b:
        wVar9 = L'\b';
        if (q1 <= q2) goto LAB_001dfd6e;
      }
      else {
        wVar9 = L'\b';
        if ((q1 <= q2) || (wVar9 = L'\x04', f1 <= f2)) goto LAB_001dfd6e;
LAB_001dfce5:
        wVar9 = L'\x01';
        if (e1 <= e2) goto LAB_001dfd6e;
      }
      break;
    case L'\x03':
    case L'\x05':
    case L'\x06':
    case L'\a':
      break;
    case L'\x04':
switchD_001dfb4b_caseD_4:
      if (uVar15 == 0x8100000000) {
        wVar9 = L'\b';
        if ((q2 < q1) && (wVar9 = L'\x02', i2 < i1)) goto LAB_001dfce5;
      }
      else {
        wVar9 = L'\x01';
        if ((e2 < e1) && (wVar9 = L'\x02', i2 < i1)) goto LAB_001dfc9b;
      }
      goto LAB_001dfd6e;
    case L'\b':
      if (uVar15 == 0x8100000000) {
        wVar9 = L'\x02';
        if ((i2 < i1) && (wVar9 = L'\x01', e2 < e1)) goto LAB_001dfd5b;
      }
      else {
        wVar9 = L'\x04';
        if ((f2 < f1) && (wVar9 = L'\x01', e2 < e1)) goto LAB_001dfd20;
      }
LAB_001dfd6e:
      player->upkeep->command_wrk = wVar9;
      break;
    default:
      if (wVar9 == L'ࠀ') goto switchD_001dfb4b_caseD_4;
    }
    newmenu = '\x01';
LAB_001dfd78:
    *choice = selection;
    screen_load();
    ppVar5 = player;
    puVar1 = &player->upkeep->redraw;
    *puVar1 = *puVar1 | 0x60000;
    redraw_stuff(ppVar5);
    prt("",L'\0',L'\0');
  } while ((*choice == (object *)0x0) && (newmenu != '\0'));
  if (bVar4) {
    toggle_inven_equip();
  }
LAB_001dfddb:
  player->upkeep->command_wrk = L'\0';
  mem_free(throwing_list);
  mem_free(floor_list);
  return *choice != (object *)0x0;
}

Assistant:

bool textui_get_item(struct object **choice, const char *pmt, const char *str,
					 cmd_code cmd, item_tester tester, int mode)
{
	bool use_inven = ((mode & USE_INVEN) ? true : false);
	bool use_equip = ((mode & USE_EQUIP) ? true : false);
	bool use_quiver = ((mode & USE_QUIVER) ? true : false);
	bool use_floor = ((mode & USE_FLOOR) ? true : false);
	bool quiver_tags = ((mode & QUIVER_TAGS) ? true : false);
	bool show_throwing = ((mode & SHOW_THROWING) ? true : false);

	bool allow_inven = false;
	bool allow_equip = false;
	bool allow_quiver = false;
	bool allow_floor = false;

	bool toggle = false;

	int floor_max = z_info->floor_size;
	int floor_num;

	int throwing_max = z_info->pack_size + z_info->quiver_size +
		z_info->floor_size;

	floor_list = mem_zalloc(floor_max * sizeof(*floor_list));
	throwing_list = mem_zalloc(throwing_max * sizeof(*throwing_list));
	olist_mode = 0;
	item_mode = mode;
	item_cmd = cmd;
	tester_m = tester;
	prompt = pmt;
	allow_all = str ? false : true;

	/* Object list display modes */
	if (mode & SHOW_FAIL)
		olist_mode |= OLIST_FAIL;
	else
		olist_mode |= OLIST_WEIGHT;

	if (mode & SHOW_PRICES)
		olist_mode |= OLIST_PRICE;

	if (mode & SHOW_EMPTY)
		olist_mode |= OLIST_SEMPTY;

	if (mode & SHOW_QUIVER)
		olist_mode |= OLIST_QUIVER;

	if (mode & SHOW_RECHARGE)
		olist_mode |= OLIST_RECHARGE;

	/* Paranoia XXX XXX XXX */
	event_signal(EVENT_MESSAGE_FLUSH);

	/* Full inventory */
	i1 = 0;
	i2 = z_info->pack_size - 1;

	/* Forbid inventory */
	if (!use_inven) i2 = -1;

	/* Restrict inventory indexes */
	while ((i1 <= i2) && (!object_test(tester, player->upkeep->inven[i1])))
		i1++;
	while ((i1 <= i2) && (!object_test(tester, player->upkeep->inven[i2])))
		i2--;

	/* Accept inventory */
	if ((i1 <= i2) || allow_all)
		allow_inven = true;
	else if (item_mode & USE_INVEN)
		item_mode -= USE_INVEN;

	/* Full equipment */
	e1 = 0;
	e2 = player->body.count - 1;

	/* Forbid equipment */
	if (!use_equip) e2 = -1;

	/* Restrict equipment indexes unless starting with no command */
	if ((cmd != CMD_NULL) || (tester != NULL)) {
		while ((e1 <= e2) && (!object_test(tester, slot_object(player, e1))))
			e1++;
		while ((e1 <= e2) && (!object_test(tester, slot_object(player, e2))))
			e2--;
	}

	/* Accept equipment */
	if ((e1 <= e2) || allow_all)
		allow_equip = true;
	else if (item_mode & USE_EQUIP)
		item_mode -= USE_EQUIP;

	/* Restrict quiver indexes */
	q1 = 0;
	q2 = z_info->quiver_size - 1;

	/* Forbid quiver */
	if (!use_quiver) q2 = -1;

	/* Restrict quiver indexes */
	while ((q1 <= q2) && (!object_test(tester, player->upkeep->quiver[q1])))
		q1++;
	while ((q1 <= q2) && (!object_test(tester, player->upkeep->quiver[q2])))
		q2--;

	/* Accept quiver */
	if ((q1 <= q2) || allow_all)
		allow_quiver = true;
	else if (item_mode & USE_QUIVER)
		item_mode -= USE_QUIVER;

	/* Scan all non-gold objects in the grid */
	floor_num = scan_floor(floor_list, floor_max, player,
		OFLOOR_TEST | OFLOOR_SENSE | OFLOOR_VISIBLE, tester);

	/* Full floor */
	f1 = 0;
	f2 = floor_num - 1;

	/* Forbid floor */
	if (!use_floor) f2 = -1;

	/* Restrict floor indexes */
	while ((f1 <= f2) && (!object_test(tester, floor_list[f1]))) f1++;
	while ((f1 <= f2) && (!object_test(tester, floor_list[f2]))) f2--;

	/* Accept floor */
	if ((f1 <= f2) || allow_all)
		allow_floor = true;
	else if (item_mode & USE_FLOOR)
		item_mode -= USE_FLOOR;

	/* Scan all throwing objects in reach */
	throwing_num = scan_items(throwing_list, throwing_max, player,
		USE_INVEN | USE_QUIVER | USE_FLOOR, obj_is_throwing);

	/* Require at least one legal choice */
	if (allow_inven || allow_equip || allow_quiver || allow_floor) {
		/* Use throwing menu if at all possible */
		if (show_throwing && throwing_num) {
			player->upkeep->command_wrk = SHOW_THROWING;

			/* Start where requested if possible */
		} else if ((player->upkeep->command_wrk == USE_EQUIP) && allow_equip)
			player->upkeep->command_wrk = USE_EQUIP;
		else if ((player->upkeep->command_wrk == USE_INVEN) && allow_inven)
			player->upkeep->command_wrk = USE_INVEN;
		else if ((player->upkeep->command_wrk == USE_QUIVER) && allow_quiver)
			player->upkeep->command_wrk = USE_QUIVER;
		else if ((player->upkeep->command_wrk == USE_FLOOR) && allow_floor)
			player->upkeep->command_wrk = USE_FLOOR;

		/* If we are obviously using the quiver then start on quiver */
		else if (quiver_tags && allow_quiver && (cmd != CMD_USE))
			player->upkeep->command_wrk = USE_QUIVER;

		/* Otherwise choose whatever is allowed */
		else if (use_inven && allow_inven)
			player->upkeep->command_wrk = USE_INVEN;
		else if (use_equip && allow_equip)
			player->upkeep->command_wrk = USE_EQUIP;
		else if (use_quiver && allow_quiver)
			player->upkeep->command_wrk = USE_QUIVER;
		else if (use_floor && allow_floor)
			player->upkeep->command_wrk = USE_FLOOR;

		/* If nothing to choose, use (empty) inventory */
		else
			player->upkeep->command_wrk = USE_INVEN;

		while (true) {
			int j;
			int ni = 0;
			int ne = 0;

			/* If inven or equip is on the main screen, and only one of them
			 * is slated for a subwindow, we should show the opposite there */
			for (j = 0; j < ANGBAND_TERM_MAX; j++) {
				/* Unused */
				if (!angband_term[j]) continue;

				/* Count windows displaying inven */
				if (window_flag[j] & (PW_INVEN)) ni++;

				/* Count windows displaying equip */
				if (window_flag[j] & (PW_EQUIP)) ne++;
			}

			/* Are we in the situation where toggling makes sense? */
			if ((ni && !ne) || (!ni && ne)) {
				if (player->upkeep->command_wrk == USE_EQUIP) {
					if ((ne && !toggle) || (ni && toggle)) {
						/* Main screen is equipment, so is subwindow */
						toggle_inven_equip();
						toggle = !toggle;
					}
				} else if (player->upkeep->command_wrk == USE_INVEN) {
					if ((ni && !toggle) || (ne && toggle)) {
						/* Main screen is inventory, so is subwindow */
						toggle_inven_equip();
						toggle = !toggle;
					}
				} else {
					/* Quiver or floor, go back to the original */
					if (toggle) {
						toggle_inven_equip();
						toggle = !toggle;
					}
				}
			}

			/* Redraw */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

			/* Redraw windows */
			redraw_stuff(player);

			/* Save screen */
			screen_save();

			/* Build object list */
			wipe_obj_list();
			if (player->upkeep->command_wrk == USE_INVEN)
				build_obj_list(i2, player->upkeep->inven, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == USE_EQUIP)
				build_obj_list(e2, NULL, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == USE_QUIVER)
				build_obj_list(q2, player->upkeep->quiver, tester_m,olist_mode);
			else if (player->upkeep->command_wrk == USE_FLOOR)
				build_obj_list(f2, floor_list, tester_m, olist_mode);
			else if (player->upkeep->command_wrk == SHOW_THROWING)
				build_obj_list(throwing_num, throwing_list, tester_m,
							   olist_mode);

			/* Show the prompt */
			menu_header();
			if (pmt) {
				prt(pmt, 0, 0);
				prt(header, 0, strlen(pmt) + 1);
			}

			/* No menu change request */
			newmenu = false;

			/* Get an item choice */
			*choice = item_menu(cmd, MAX(pmt ? strlen(pmt) : 0, 15), mode);

			/* Fix the screen */
			screen_load();

			/* Update */
			player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
			redraw_stuff(player);

			/* Clear the prompt line */
			prt("", 0, 0);

			/* We have a selection, or are backing out */
			if (*choice || !newmenu) {
				if (toggle) toggle_inven_equip();
				break;
			}
		}
	} else {
		/* Warning if needed */
		if (str) msg("%s", str);
		*choice = NULL;
	}

	/* Clean up */
	player->upkeep->command_wrk = 0;
	mem_free(throwing_list);
	mem_free(floor_list);

	/* Result */
	return (*choice != NULL) ? true : false;
}